

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_enc_dec.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint K;
  uint symSize;
  int iVar1;
  string *psVar2;
  char *__s;
  allocator<char> local_139;
  uint local_138;
  uint local_134;
  string inputEsiStr;
  string outputEsiStr;
  string outputFname;
  string inputFname;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inputFname,"input.bin",(allocator<char> *)&outputFname);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&outputFname,"output.bin",(allocator<char> *)&inputEsiStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inputEsiStr,"",(allocator<char> *)&outputEsiStr);
  std::__cxx11::string::string<std::allocator<char>>((string *)&outputEsiStr,"",&local_139);
  local_134 = 0x200;
  local_138 = 5;
  do {
    while (iVar1 = getopt(argc,argv,"hi:T:K:o:I:O:"), iVar1 == 0x49) {
      psVar2 = &inputEsiStr;
LAB_00103261:
      std::__cxx11::string::assign((char *)psVar2);
    }
    psVar2 = &outputEsiStr;
    if (iVar1 == 0x4f) goto LAB_00103261;
    if (iVar1 == 0x69) {
      psVar2 = &inputFname;
      goto LAB_00103261;
    }
    psVar2 = &outputFname;
    if (iVar1 == 0x6f) goto LAB_00103261;
    if (iVar1 == -1) {
      puts("Settings used: ");
      K = local_138;
      printf("K: %d\n",(ulong)local_138);
      symSize = local_134;
      printf("Symbol size: %d\n",(ulong)local_134);
      printf("Input Filename: %s\n",inputFname._M_dataplus._M_p);
      printf("Output Filename: %s\n",outputFname._M_dataplus._M_p);
      expandEsiStr(&inputEsiStr);
      std::__cxx11::string::_M_assign((string *)&inputEsiStr);
      printf("Input ESI string: %s\n",inputEsiStr._M_dataplus._M_p);
      expandEsiStr(&outputEsiStr);
      std::__cxx11::string::_M_assign((string *)&outputEsiStr);
      printf("Output ESI string: %s\n",outputEsiStr._M_dataplus._M_p);
      std::__cxx11::string::string((string *)&local_50,(string *)&inputFname);
      std::__cxx11::string::string((string *)&local_70,(string *)&outputFname);
      std::__cxx11::string::string((string *)&local_90,(string *)&inputEsiStr);
      std::__cxx11::string::string((string *)&local_b0,(string *)&outputEsiStr);
      iVar1 = transcode(K,symSize,&local_50,&local_70,&local_90,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      __s = "--> Succeeded\n";
      if (iVar1 == 0) {
        __s = "--> Failed\n";
      }
      puts(__s);
      std::__cxx11::string::~string((string *)&outputEsiStr);
      std::__cxx11::string::~string((string *)&inputEsiStr);
      std::__cxx11::string::~string((string *)&outputFname);
      std::__cxx11::string::~string((string *)&inputFname);
      return (uint)(iVar1 == 0);
    }
    if (iVar1 == 0x4b) {
      local_138 = atoi(_optarg);
    }
    else if (iVar1 == 0x54) {
      local_134 = atoi(_optarg);
    }
    else {
      if (iVar1 == 0x3f) {
        exit(1);
      }
      if (iVar1 == 0x68) {
        puts(
            "RQ File Encoder Decoder.\n\n   -h          display this help screen and exit\n   -i <str>    indicates the input filename to use for the operation\n   -o <str>    indicates the output filename to write output for the operation\n   -K <value>  the k value to use for encode/decode\n   -T <value>  the symbol size to use for encode/decode\n   -I <str>    input ESI string\n   -O <str>    output ESI string\n"
            );
        exit(0);
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    int Kval = 5;
    int symSize = 512;

    string inputFname = "input.bin";
    string outputFname = "output.bin";
    string inputEsiStr = "";
    string outputEsiStr = "";


    /* scan command lines */
    int c;
    while ((c = getopt(argc, argv, "hi:T:K:o:I:O:")) != -1) {
        switch (c) {
        case 'h':
            usage();
            break;
        case 'i':
            inputFname = optarg;
            break;
        case 'o':
            outputFname = optarg;
            break;
        case 'I':
            inputEsiStr = optarg;
            break;
        case 'O':
            outputEsiStr = optarg;
            break;
        case 'T':
            symSize = atoi(optarg);
            break;
        case 'K':
            Kval = atoi(optarg);
            break;
        case '?':
            exit(EXIT_FAILURE);
        };
    }

    /* Dump the input arguments */
    printf ("Settings used: \n");
    printf ("K: %d\n", Kval);
    printf ("Symbol size: %d\n", symSize);
    printf ("Input Filename: %s\n", inputFname.c_str());
    printf ("Output Filename: %s\n", outputFname.c_str());
    inputEsiStr = expandEsiStr(inputEsiStr);
    printf ("Input ESI string: %s\n", inputEsiStr.c_str());
    outputEsiStr = expandEsiStr(outputEsiStr);
    printf ("Output ESI string: %s\n", outputEsiStr.c_str());

    /* Encode/Decode */
    int status = 0;

    if (transcode(Kval, symSize, inputFname, outputFname, inputEsiStr, outputEsiStr)) {
        printf("--> Succeeded\n\n");
    } else {
        printf("--> Failed\n\n");
        status = 1;
    }

    return status;
}